

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjectType.cpp
# Opt level: O0

void __thiscall KDIS::DATA_TYPE::ObjectType::Encode(ObjectType *this,KDataStream *stream)

{
  KDataStream *pKVar1;
  KDataStream *stream_local;
  ObjectType *this_local;
  
  pKVar1 = KDataStream::operator<<(stream,this->m_ui8Domain);
  pKVar1 = KDataStream::operator<<(pKVar1,this->m_ui8EntityKind);
  pKVar1 = KDataStream::operator<<(pKVar1,this->m_ui8Category);
  KDataStream::operator<<(pKVar1,this->m_ui8SubCategory);
  return;
}

Assistant:

void ObjectType::Encode( KDataStream & stream ) const
{
    stream << m_ui8Domain
           << m_ui8EntityKind
           << m_ui8Category
           << m_ui8SubCategory;
}